

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool AvalancheTest<Blob<768>,Blob<160>>(pfHash hash,int reps,bool verbose)

{
  pointer piVar1;
  double dVar2;
  vector<int,_std::allocator<int>_> local_60;
  Rand local_48;
  
  local_48.x = 0x24973e3e;
  local_48.y = 0x15a494c7;
  local_48.z = 0x256e9382;
  local_48.w = 0xb96c8457;
  printf("Testing %4d-bit keys -> %3d-bit hashes, %6d reps",0x300,0xa0,reps);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x78000);
  piVar1 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 0x1e000;
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar1;
  memset(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start,0,0x78000);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       piVar1;
  calcBias<Blob<768>,Blob<160>>(hash,&local_60,reps,&local_48,verbose);
  dVar2 = maxBias(&local_60,reps);
  printf(" worst bias is %f%%",dVar2 * 100.0);
  if (0.01 < dVar2) {
    printf(" !!!!!");
  }
  putchar(10);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar2 <= 0.01;
}

Assistant:

bool AvalancheTest ( pfHash hash, const int reps, bool verbose )
{
  Rand r(48273);
  
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  printf("Testing %4d-bit keys -> %3d-bit hashes, %6d reps",
         keybits, hashbits, reps);

  //----------

  std::vector<int> bins(keybits*hashbits,0);

  calcBias<keytype,hashtype>(hash,bins,reps,r,verbose);
  
  //----------

  bool result = true;

  double b = maxBias(bins,reps);

  printf(" worst bias is %f%%", b * 100.0);

  if(b > AVALANCHE_FAIL)
  {
    printf(" !!!!!");
    result = false;
  }
  printf("\n");
  return result;
}